

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leakagemodel.cpp
# Opt level: O0

double __thiscall
PowerLeakageModel::findFlow
          (PowerLeakageModel *this,double a,double b,double length,double h,double *dqdh)

{
  double dVar1;
  double q;
  double *dqdh_local;
  double h_local;
  double length_local;
  double b_local;
  double a_local;
  PowerLeakageModel *this_local;
  
  if (0.0 < h) {
    dVar1 = pow(h * (this->super_LeakageModel).pressureUcf,b);
    this_local = (PowerLeakageModel *)
                 (((a * dVar1 * length * (this->super_LeakageModel).lengthUcf) / 1000.0) /
                 (this->super_LeakageModel).flowUcf);
    *dqdh = ((b * (double)this_local) / h) / 2.0;
  }
  else {
    *dqdh = 0.0;
    this_local = (PowerLeakageModel *)0x0;
  }
  return (double)this_local;
}

Assistant:

double PowerLeakageModel::findFlow(double a, double b, double length, double h,
                                   double& dqdh)
{
    // no leakage for non-positive pressure head
    if ( h <= 0.0 )
    {
        dqdh = 0.0;
        return 0.0;
    }

    // ... find leakage using original units
    double q = a * pow(h * pressureUcf, b) * length * lengthUcf / 1000.0;

    // ... convert leakage to cfs
    q /= flowUcf;

    // ... compute half gradient in units of cfs/ft
    dqdh = b * q / h / 2.0;
    return q;
}